

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_segs.cpp
# Opt level: O2

void PrepLWall(fixed_t *lwall,double walxrepeat,int x1,int x2)

{
  long lVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar2 = ABS(walxrepeat * 65536.0);
  dVar4 = (double)WallT.UoverZstep;
  dVar6 = (double)WallT.InvZstep;
  dVar3 = (double)(x1 - centerx) * dVar6 + (double)WallT.InvZorg;
  dVar5 = (dVar4 * (double)(x1 - centerx) + (double)WallT.UoverZorg) * dVar2;
  for (lVar1 = (long)x1; lVar1 < x2; lVar1 = lVar1 + 1) {
    lwall[lVar1] = ~-(uint)(walxrepeat < 0.0) & SUB84(dVar5 / dVar3 + 6755399441055744.0,0) |
                   SUB84((dVar2 + 6755399441055744.0) - dVar5 / dVar3,0) & -(uint)(walxrepeat < 0.0)
    ;
    dVar5 = dVar5 + dVar4 * dVar2;
    dVar3 = dVar3 + dVar6;
  }
  PrepWallRoundFix(lwall,SUB84(walxrepeat + 103079215104.0,0),x1,x2);
  return;
}

Assistant:

void PrepLWall (fixed_t *lwall, double walxrepeat, int x1, int x2)
{ // lwall = texturecolumn
	double top, bot, i;
	double xrepeat = fabs(walxrepeat * 65536);
	double topstep, botstep;

	i = x1 - centerx;
	top = WallT.UoverZorg + WallT.UoverZstep * i;
	bot = WallT.InvZorg + WallT.InvZstep * i;

	top *= xrepeat;
	topstep = WallT.UoverZstep * xrepeat;
	botstep = WallT.InvZstep;

	for (int x = x1; x < x2; x++)
	{
		if (walxrepeat < 0)
		{
			lwall[x] = xs_RoundToInt(xrepeat - top / bot);
		}
		else
		{
			lwall[x] = xs_RoundToInt(top / bot);
		}
		top += topstep;
		bot += botstep;
	}
	PrepWallRoundFix(lwall, FLOAT2FIXED(walxrepeat), x1, x2);
}